

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O0

void store_object_absorb(object *old,object *new)

{
  _Bool _Var1;
  wchar_t local_20;
  object *poStack_18;
  wchar_t total;
  object *new_local;
  object *old_local;
  
  local_20 = (uint)old->number + (uint)new->number;
  if (old->kind->base->max_stack < local_20) {
    local_20 = old->kind->base->max_stack;
  }
  old->number = (uint8_t)local_20;
  poStack_18 = new;
  new_local = old;
  _Var1 = tval_can_have_timeout(old);
  if (_Var1) {
    new_local->timeout = new_local->timeout + poStack_18->timeout;
  }
  _Var1 = tval_can_have_charges(new_local);
  if (_Var1) {
    new_local->pval = new_local->pval + poStack_18->pval;
  }
  object_origin_combine(new_local,poStack_18);
  object_delete((chunk *)0x0,(chunk *)0x0,&stack0xffffffffffffffe8);
  return;
}

Assistant:

static void store_object_absorb(struct object *old, struct object *new)
{
	int total = old->number + new->number;

	/* Combine quantity, lose excess items */
	old->number = MIN(total, old->kind->base->max_stack);

	/* If rods are stacking, add the charging timeouts */
	if (tval_can_have_timeout(old))
		old->timeout += new->timeout;

	/* If wands/staves are stacking, combine the charges */
	if (tval_can_have_charges(old))
		old->pval += new->pval;

	object_origin_combine(old, new);

	/* Fully absorbed */
	object_delete(NULL, NULL, &new);
}